

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfedge.cpp
# Opt level: O0

Edges * __thiscall
graphics101::HalfEdgeTriMesh::boundary_edges(Edges *__return_storage_ptr__,HalfEdgeTriMesh *this)

{
  ulong uVar1;
  size_type sVar2;
  long local_60;
  HalfEdgeIndex local_58;
  Edge local_4c;
  Edge de;
  long local_38;
  HalfEdgeIndex local_30;
  HalfEdge *local_28;
  HalfEdge *he;
  int hei;
  HalfEdgeTriMesh *this_local;
  Edges *result;
  
  he._7_1_ = 0;
  _hei = this;
  this_local = (HalfEdgeTriMesh *)__return_storage_ptr__;
  std::
  vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
  ::vector(__return_storage_ptr__);
  for (he._0_4_ = 0; uVar1 = (ulong)(int)he,
      sVar2 = std::
              vector<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
              ::size(&this->m_halfedges), uVar1 < sVar2; he._0_4_ = (int)he + 1) {
    local_38 = (long)(int)he;
    HalfEdgeIndex::HalfEdgeIndex(&local_30,&local_38);
    local_28 = halfedge(this,&local_30);
    if (local_28->face == -1) {
      local_60 = (long)(int)he;
      HalfEdgeIndex::HalfEdgeIndex(&local_58,&local_60);
      local_4c = he_index2directed_edge(this,local_58);
      std::
      vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
      ::push_back(__return_storage_ptr__,&local_4c);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

HalfEdgeTriMesh::Edges HalfEdgeTriMesh::boundary_edges() const
{
    Edges result;
    for( int hei = 0; hei < m_halfedges.size(); ++hei )
    {
        const HalfEdge& he = halfedge( HalfEdgeIndex( hei ) );

        if( -1 == he.face )
        {
            const auto de = he_index2directed_edge( HalfEdgeIndex( hei ) );
            result.push_back( de );
        }
    }

    return result;
}